

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.cpp
# Opt level: O3

Expression * wasm::TypeUpdating::fixLocalGet(LocalGet *get,Module *wasm)

{
  undefined4 uVar1;
  uintptr_t uVar2;
  Expression *pEVar3;
  pointer ppEVar4;
  Type TVar5;
  TupleMake *this;
  size_t sVar6;
  TupleExtract *this_00;
  Type *pTVar7;
  RefAs *this_01;
  ulong uVar8;
  Iterator local_78;
  Type local_68;
  Type type;
  undefined1 local_50 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> elems;
  Builder builder;
  
  local_68.id = (get->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id;
  if ((local_68.id & 3) == 0 && 6 < local_68.id) {
    TVar5 = getValidLocalType(local_68,(FeatureSet)(wasm->features).features);
    (get->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = TVar5.id;
    this = (TupleMake *)MixedArena::allocSpace(&wasm->allocator,0x20,8);
    (((SpecificExpression<(wasm::Expression::Id)81> *)
     &this->super_SpecificExpression<(wasm::Expression::Id)57>)->super_Expression)._id = RefAsId;
    (((SpecificExpression<(wasm::Expression::Id)81> *)
     &this->super_SpecificExpression<(wasm::Expression::Id)57>)->super_Expression).type.id = 0;
    *(RefAsOp *)
     &(this->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      data = RefAsNonNull;
    (this->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
    usedElements = (size_t)get;
    RefAs::finalize((RefAs *)this);
    get = (LocalGet *)this;
  }
  else if ((local_68.id & 1) != 0 && 6 < local_68.id) {
    TVar5 = getValidLocalType(local_68,(FeatureSet)(wasm->features).features);
    (get->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = TVar5.id;
    sVar6 = wasm::Type::size(&local_68);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_50,sVar6,
               (allocator_type *)&local_78);
    elems.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)wasm;
    sVar6 = wasm::Type::size(&local_68);
    if ((int)sVar6 != 0) {
      uVar8 = 0;
      type.id = (uintptr_t)get;
      do {
        TVar5.id = type.id;
        if (uVar8 != 0) {
          uVar1 = *(undefined4 *)(type.id + 0x10);
          uVar2 = *(uintptr_t *)(type.id + 8);
          TVar5.id = (uintptr_t)MixedArena::allocSpace(&wasm->allocator,0x18,8);
          ((Expression *)TVar5.id)->_id = LocalGetId;
          *(undefined4 *)(TVar5.id + 0x10) = uVar1;
          (((Expression *)TVar5.id)->type).id = uVar2;
          wasm = (Module *)
                 elems.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        this_00 = (TupleExtract *)MixedArena::allocSpace(&wasm->allocator,0x20,8);
        (this_00->super_SpecificExpression<(wasm::Expression::Id)58>).super_Expression._id =
             TupleExtractId;
        (this_00->super_SpecificExpression<(wasm::Expression::Id)58>).super_Expression.type.id = 0;
        this_00->tuple = (Expression *)TVar5.id;
        this_00->index = (Index)uVar8;
        TupleExtract::finalize(this_00);
        *(TupleExtract **)((long)local_50 + uVar8 * 8) = this_00;
        local_78.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             &local_68;
        local_78.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = uVar8;
        pTVar7 = wasm::Type::Iterator::operator*(&local_78);
        ppEVar4 = elems.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
        if ((pTVar7->id & 3) == 0 && 6 < pTVar7->id) {
          pEVar3 = *(pointer)((long)local_50 + uVar8 * 8);
          this_01 = (RefAs *)MixedArena::allocSpace
                                       ((MixedArena *)
                                        (elems.
                                         super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x40),
                                        0x20,8);
          (this_01->super_SpecificExpression<(wasm::Expression::Id)81>).super_Expression._id =
               RefAsId;
          (this_01->super_SpecificExpression<(wasm::Expression::Id)81>).super_Expression.type.id = 0
          ;
          this_01->op = RefAsNonNull;
          this_01->value = pEVar3;
          RefAs::finalize(this_01);
          *(RefAs **)((long)local_50 + uVar8 * 8) = this_01;
          wasm = (Module *)ppEVar4;
        }
        uVar8 = uVar8 + 1;
      } while ((sVar6 & 0xffffffff) != uVar8);
    }
    get = (LocalGet *)
          Builder::makeTupleMake<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                    ((Builder *)
                     &elems.
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_50);
    if (local_50 != (undefined1  [8])0x0) {
      operator_delete((void *)local_50,
                      (long)elems.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)local_50);
    }
  }
  return (Expression *)(TupleMake *)get;
}

Assistant:

Expression* fixLocalGet(LocalGet* get, Module& wasm) {
  if (get->type.isNonNullable()) {
    // The get should now return a nullable value, and a ref.as_non_null
    // fixes that up.
    get->type = getValidLocalType(get->type, wasm.features);
    return Builder(wasm).makeRefAs(RefAsNonNull, get);
  }
  if (get->type.isTuple()) {
    auto type = get->type;
    get->type = getValidLocalType(type, wasm.features);
    std::vector<Expression*> elems(type.size());
    Builder builder(wasm);
    for (Index i = 0, size = type.size(); i < size; ++i) {
      auto* elemGet =
        i == 0 ? get : builder.makeLocalGet(get->index, get->type);
      elems[i] = builder.makeTupleExtract(elemGet, i);
      if (type[i].isNonNullable()) {
        elems[i] = builder.makeRefAs(RefAsNonNull, elems[i]);
      }
    }
    return builder.makeTupleMake(std::move(elems));
  }
  return get;
}